

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserPafTest_FormatError_Test::~BioparserPafTest_FormatError_Test
          (BioparserPafTest_FormatError_Test *this)

{
  BioparserPafTest::~BioparserPafTest(&this->super_BioparserPafTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserPafTest, FormatError) {
  Setup("sample.mhap");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::PafParser] error: invalid file format");
  }
}